

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fTextureGatherTests.cpp
# Opt level: O3

void __thiscall
deqp::gles31::Functional::anon_unknown_0::TextureGather2DArrayCase::generateIterations
          (TextureGather2DArrayCase *this)

{
  GatherType gatherType;
  ChannelOrder CVar1;
  pointer pIVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  undefined8 uVar7;
  uint uVar8;
  uint uVar9;
  int *piVar10;
  int iVar11;
  ulong uVar12;
  vector<deqp::gles31::Functional::(anonymous_namespace)::GatherArgs,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::GatherArgs>_>
  basicIterations;
  undefined1 local_70 [48];
  _Alloc_hider local_40;
  size_type local_38;
  
  gatherType = (this->super_TextureGatherCase).m_gatherType;
  TextureGatherCase::getOffsetRange((TextureGatherCase *)local_70);
  generateBasic2DCaseIterations
            ((vector<deqp::gles31::Functional::(anonymous_namespace)::GatherArgs,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::GatherArgs>_>
              *)(local_70 + 0x28),gatherType,
             (TextureFormat *)(ulong)(this->super_TextureGatherCase).m_textureFormat.order,
             (IVec2 *)local_70);
  if (-1 < (this->m_textureSize).m_data[2] + 1) {
    uVar8 = (int)((long)local_40._M_p - local_70._40_8_ >> 2) * 0x38e38e39;
    iVar11 = -1;
    do {
      if (iVar11 == 0) {
        piVar10 = (int *)local_70._40_8_;
        uVar12 = (ulong)(uVar8 & 0x7fffffff);
        if (0 < (int)uVar8) {
          do {
            local_70._36_4_ = 0;
            local_70._0_4_ = -1;
            local_70._20_4_ = 0;
            local_70._24_4_ = 0;
            local_70._28_4_ = 0;
            local_70._32_4_ = 0;
            local_70._4_4_ = 0;
            local_70._8_4_ = 0;
            local_70._12_4_ = 0;
            local_70._16_4_ = 0;
            std::
            vector<deqp::gles31::Functional::(anonymous_namespace)::TextureGather2DArrayCase::Iteration,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::TextureGather2DArrayCase::Iteration>_>
            ::push_back(&this->m_iterations,(value_type *)local_70);
            pIVar2 = (this->m_iterations).
                     super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::TextureGather2DArrayCase::Iteration,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::TextureGather2DArrayCase::Iteration>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
            pIVar2[-1].gatherArgs.offsets[3].m_data[1] = piVar10[8];
            iVar3 = *piVar10;
            iVar4 = piVar10[1];
            iVar5 = piVar10[2];
            iVar6 = piVar10[3];
            uVar7 = *(undefined8 *)(piVar10 + 6);
            *(undefined8 *)(pIVar2[-1].gatherArgs.offsets[1].m_data + 1) =
                 *(undefined8 *)(piVar10 + 4);
            *(undefined8 *)(pIVar2[-1].gatherArgs.offsets[2].m_data + 1) = uVar7;
            pIVar2[-1].gatherArgs.componentNdx = iVar3;
            pIVar2[-1].gatherArgs.offsets[0].m_data[0] = iVar4;
            pIVar2[-1].gatherArgs.offsets[0].m_data[1] = iVar5;
            pIVar2[-1].gatherArgs.offsets[1].m_data[0] = iVar6;
            (this->m_iterations).
            super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::TextureGather2DArrayCase::Iteration,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::TextureGather2DArrayCase::Iteration>_>
            ._M_impl.super__Vector_impl_data._M_finish[-1].layerNdx = 0;
            uVar12 = uVar12 - 1;
            piVar10 = piVar10 + 9;
          } while (uVar12 != 0);
        }
      }
      else if (0 < (int)uVar8) {
        CVar1 = (this->super_TextureGatherCase).m_textureFormat.order;
        uVar9 = iVar11 + 5;
        if (-1 < (int)(iVar11 + 2U)) {
          uVar9 = iVar11 + 2U;
        }
        uVar12 = 0;
        piVar10 = (int *)local_70._40_8_;
        do {
          if (((CVar1 == D) || (CVar1 == DS)) || (*piVar10 == (iVar11 - (uVar9 & 0xfffffffc)) + 2))
          {
            local_70._36_4_ = 0;
            local_70._0_4_ = -1;
            local_70._20_4_ = 0;
            local_70._24_4_ = 0;
            local_70._28_4_ = 0;
            local_70._32_4_ = 0;
            local_70._4_4_ = 0;
            local_70._8_4_ = 0;
            local_70._12_4_ = 0;
            local_70._16_4_ = 0;
            std::
            vector<deqp::gles31::Functional::(anonymous_namespace)::TextureGather2DArrayCase::Iteration,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::TextureGather2DArrayCase::Iteration>_>
            ::push_back(&this->m_iterations,(value_type *)local_70);
            uVar12 = uVar12 & 0xffffffff;
            pIVar2 = (this->m_iterations).
                     super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::TextureGather2DArrayCase::Iteration,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::TextureGather2DArrayCase::Iteration>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
            pIVar2[-1].gatherArgs.offsets[3].m_data[1] =
                 ((int *)(local_70._40_8_ + 0x20))[uVar12 * 9];
            piVar10 = (int *)(local_70._40_8_ + uVar12 * 0x24);
            iVar3 = *piVar10;
            iVar4 = piVar10[1];
            iVar5 = piVar10[2];
            iVar6 = piVar10[3];
            uVar7 = *(undefined8 *)((int *)(local_70._40_8_ + 0x10) + uVar12 * 9 + 2);
            *(undefined8 *)(pIVar2[-1].gatherArgs.offsets[1].m_data + 1) =
                 *(undefined8 *)((int *)(local_70._40_8_ + 0x10) + uVar12 * 9);
            *(undefined8 *)(pIVar2[-1].gatherArgs.offsets[2].m_data + 1) = uVar7;
            pIVar2[-1].gatherArgs.componentNdx = iVar3;
            pIVar2[-1].gatherArgs.offsets[0].m_data[0] = iVar4;
            pIVar2[-1].gatherArgs.offsets[0].m_data[1] = iVar5;
            pIVar2[-1].gatherArgs.offsets[1].m_data[0] = iVar6;
            (this->m_iterations).
            super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::TextureGather2DArrayCase::Iteration,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::TextureGather2DArrayCase::Iteration>_>
            ._M_impl.super__Vector_impl_data._M_finish[-1].layerNdx = iVar11;
            break;
          }
          uVar12 = uVar12 + 1;
          piVar10 = piVar10 + 9;
        } while ((uVar8 & 0x7fffffff) != uVar12);
      }
      iVar11 = iVar11 + 1;
    } while (iVar11 < (this->m_textureSize).m_data[2] + 1);
  }
  if ((int *)local_70._40_8_ == (int *)0x0) {
    return;
  }
  operator_delete((void *)local_70._40_8_,local_38 - local_70._40_8_);
  return;
}

Assistant:

void TextureGather2DArrayCase::generateIterations (void)
{
	DE_ASSERT(m_iterations.empty());

	const vector<GatherArgs> basicIterations = generateBasic2DCaseIterations(m_gatherType, m_textureFormat, getOffsetRange());

	// \note Out-of-bounds layer indices are tested too.
	for (int layerNdx = -1; layerNdx < m_textureSize.z()+1; layerNdx++)
	{
		// Don't duplicate all cases for all layers.
		if (layerNdx == 0)
		{
			for (int basicNdx = 0; basicNdx < (int)basicIterations.size(); basicNdx++)
			{
				m_iterations.push_back(Iteration());
				m_iterations.back().gatherArgs = basicIterations[basicNdx];
				m_iterations.back().layerNdx = layerNdx;
			}
		}
		else
		{
			// For other layers than 0, only test one component and one set of offsets per layer.
			for (int basicNdx = 0; basicNdx < (int)basicIterations.size(); basicNdx++)
			{
				if (isDepthFormat(m_textureFormat) || basicIterations[basicNdx].componentNdx == (layerNdx + 2) % 4)
				{
					m_iterations.push_back(Iteration());
					m_iterations.back().gatherArgs = basicIterations[basicNdx];
					m_iterations.back().layerNdx = layerNdx;
					break;
				}
			}
		}
	}
}